

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O0

void rifft2d(float *data,long M2,long M)

{
  long lVar1;
  xdouble *outdata;
  long iRsiz;
  ulong Nrows;
  byte bVar2;
  long in_RDX;
  long in_RSI;
  long i1;
  long in_stack_ffffffffffffff80;
  ulong in_stack_ffffffffffffff88;
  float *in_stack_ffffffffffffff90;
  float *in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  float *in_stack_ffffffffffffffa8;
  long in_stack_ffffffffffffffb0;
  xdouble *in_stack_ffffffffffffffb8;
  long in_stack_ffffffffffffffc0;
  xdouble *in_stack_ffffffffffffffc8;
  undefined8 local_20;
  byte bVar3;
  
  if ((in_RSI < 1) || (in_RDX < 1)) {
    riffts(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  else {
    bVar2 = (byte)in_RSI;
    bVar3 = (byte)in_RDX;
    if (in_RDX == 1) {
      dxpose(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      riffts(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      xpose(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
            (long)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      dxpose(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    else if (in_RDX == 2) {
      lVar1 = 1L << (bVar2 & 0x3f);
      dxpose(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,lVar1,
             (long)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      riffts(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      xpose(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
            (long)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      outdata = (xdouble *)((ulong)(1L << (bVar3 & 0x3f)) >> 1);
      dxpose(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,outdata,lVar1,
             (long)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      iRsiz = 1L << (bVar2 & 0x3f);
      dxpose(in_stack_ffffffffffffffc8,iRsiz,outdata,lVar1,(long)in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
      iffts(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      dxpose((xdouble *)((ulong)(1L << (bVar3 & 0x3f)) >> 1),iRsiz,outdata,lVar1,
             (long)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    else {
      in_stack_ffffffffffffff90 = (float *)(1L << (bVar2 & 0x3f));
      dxpose(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      riffts(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      xpose(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
            (long)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      dxpose(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      lVar1 = 1L << (bVar2 & 0x3f);
      dxpose(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,lVar1);
      iffts(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      Nrows = (ulong)(1L << (bVar3 & 0x3f)) >> 1;
      dxpose(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,Nrows,lVar1);
      for (local_20 = 4; local_20 < (ulong)(1L << (bVar3 & 0x3f)) >> 1; local_20 = local_20 + 4) {
        in_stack_ffffffffffffff80 = 1L << (bVar2 & 0x3f);
        dxpose(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0,Nrows,lVar1);
        iffts(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff88 = (ulong)(1L << (bVar3 & 0x3f)) >> 1;
        dxpose(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0,Nrows,lVar1);
      }
    }
    riffts(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void rifft2d(float *data, long M2, long M){
/* Compute 2D real ifft and return results in-place	*/
/* The input must be in the order as outout from rfft2d */
/* INPUTS */
/* *data = input data array	*/
/* M2 = log2 of fft size number of rows out */
/* M = log2 of fft size number of columns out */
/* OUTPUTS */
/* *data = output data array	*/
long i1;
if((M2>0)&&(M>0)){
	if (M==1){
		cxpose(data, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		riffts(Array2d[M2], M2, 2);
		xpose(Array2d[M2], POW2(M2), Array2d[M2]+POW2(M2)*2, 2, 2, POW2(M2));
		cxpose(Array2d[M2]+POW2(M2)*2, POW2(M2), data, POW2(M)/2, 1, POW2(M2));
	}
	else if (M==2){
		cxpose(data, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		riffts(Array2d[M2], M2, 2);
		xpose(Array2d[M2], POW2(M2), Array2d[M2]+POW2(M2)*2, 2, 2, POW2(M2)); 
		cxpose(Array2d[M2]+POW2(M2)*2, POW2(M2), data, POW2(M)/2, 1, POW2(M2));

		cxpose(data + 2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		iffts(Array2d[M2], M2, 1);
		cxpose(Array2d[M2], POW2(M2), data + 2, POW2(M)/2, 1, POW2(M2));
	}
	else{
		cxpose(data, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		riffts(Array2d[M2], M2, 2);
		xpose(Array2d[M2], POW2(M2), Array2d[M2]+POW2(M2)*2, 2, 2, POW2(M2));
		cxpose(Array2d[M2]+POW2(M2)*2, POW2(M2), data, POW2(M)/2, 1, POW2(M2));

		cxpose(data + 2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 3);
		iffts(Array2d[M2], M2, 3);
		cxpose(Array2d[M2], POW2(M2), data + 2, POW2(M)/2, 3, POW2(M2));
		for (i1=4; i1<POW2(M)/2; i1+=4){
			cxpose(data + i1*2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 4);
			iffts(Array2d[M2], M2, 4);
			cxpose(Array2d[M2], POW2(M2), data + i1*2, POW2(M)/2, 4, POW2(M2));
		}
	}
	riffts(data, M, POW2(M2));
}
else
	riffts(data, M2+M, 1);
}